

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_SQUAD.cpp
# Opt level: O3

void __thiscall
chrono::ChFunctionRotation_SQUAD::ChFunctionRotation_SQUAD
          (ChFunctionRotation_SQUAD *this,ChFunctionRotation_SQUAD *other)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  ulong rows;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  Index index;
  ulong uVar12;
  long lVar13;
  Index size;
  
  (this->super_ChFunctionRotation)._vptr_ChFunctionRotation =
       (_func_int **)&PTR__ChFunctionRotation_SQUAD_00b46fa0;
  (this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  this->rotations =
       (vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>)
       SUB3224(ZEXT432(0) << 0x40,0);
  (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)SUB328(ZEXT432(0) << 0x40,0x18);
  std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>::
  operator=(&this->rotations,&other->rotations);
  this->p = other->p;
  pdVar3 = (other->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  rows = (other->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_rows;
  if ((this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != rows) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows,1)
    ;
    if ((this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != rows) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                   );
    }
  }
  pdVar4 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar12 = rows + 7;
  if (-1 < (long)rows) {
    uVar12 = rows;
  }
  uVar12 = uVar12 & 0xfffffffffffffff8;
  if (7 < (long)rows) {
    lVar13 = 0;
    do {
      pdVar2 = pdVar3 + lVar13;
      dVar5 = pdVar2[1];
      dVar6 = pdVar2[2];
      dVar7 = pdVar2[3];
      dVar8 = pdVar2[4];
      dVar9 = pdVar2[5];
      dVar10 = pdVar2[6];
      dVar11 = pdVar2[7];
      pdVar1 = pdVar4 + lVar13;
      *pdVar1 = *pdVar2;
      pdVar1[1] = dVar5;
      pdVar1[2] = dVar6;
      pdVar1[3] = dVar7;
      pdVar1[4] = dVar8;
      pdVar1[5] = dVar9;
      pdVar1[6] = dVar10;
      pdVar1[7] = dVar11;
      lVar13 = lVar13 + 8;
    } while (lVar13 < (long)uVar12);
  }
  if ((long)uVar12 < (long)rows) {
    do {
      pdVar4[uVar12] = pdVar3[uVar12];
      uVar12 = uVar12 + 1;
    } while (rows != uVar12);
  }
  (this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (other->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(other->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  this->closed = other->closed;
  return;
}

Assistant:

ChFunctionRotation_SQUAD::ChFunctionRotation_SQUAD(const ChFunctionRotation_SQUAD& other) {
		this->rotations = other.rotations;
		this->p = other.p;
		this->knots = other.knots;
		this->space_fx = other.space_fx;
		this->closed = other.closed;
	}